

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

size_t rtosc_print_arg_vals
                 (rtosc_arg_val_t *args,size_t n,char *buffer,size_t bs,rtosc_print_options *opt,
                 int cols_used)

{
  char *__dest;
  char *__src;
  char cVar1;
  long lVar2;
  char *pcVar3;
  uint8_t *puVar4;
  rtosc_arg_val_t *buffer_00;
  int32_t iVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  rtosc_print_options *opt_00;
  char *pcVar9;
  size_t sVar10;
  rtosc_arg_val_t *prev_arg_if_range;
  rtosc_arg_val_t *prVar11;
  size_t sVar12;
  rtosc_arg_val_t *prStack_90;
  rtosc_arg_val_t local_88;
  int32_t local_6c;
  uint8_t *local_68;
  rtosc_print_options *local_60;
  ulong local_58;
  rtosc_arg_val_t *local_50;
  char *local_48;
  size_t local_40;
  int local_34 [2];
  int cols_used_local;
  
  local_60 = (rtosc_print_options *)_compoundliteral;
  if (opt != (rtosc_print_options *)0x0) {
    local_60 = opt;
  }
  prStack_90 = (rtosc_arg_val_t *)0x10d74b;
  local_34[0] = cols_used;
  local_88.val.t = strlen(local_60->sep);
  lVar2 = -(n * 0x18 + 0xf & 0xfffffffffffffff0);
  local_88._0_8_ = (long)&local_88 + lVar2;
  if (n == 0) {
    sVar12 = 0;
  }
  else {
    local_48 = buffer + -1;
    local_58 = (ulong)(cols_used != 0);
    local_68 = (uint8_t *)0x0;
    local_40 = 0;
    opt_00 = local_60;
    local_88.val.b.data = (uint8_t *)n;
    local_50 = (rtosc_arg_val_t *)buffer;
    while( true ) {
      puVar4 = local_68;
      prVar11 = (rtosc_arg_val_t *)local_88._0_8_;
      sVar10 = (long)local_88.val.b.data - (long)local_68;
      *(undefined8 *)((long)&prStack_90 + lVar2) = 0x10d7c3;
      local_6c = rtosc_convert_to_range(args,sVar10,prVar11,opt_00);
      buffer_00 = local_50;
      if (local_6c == 0) {
        prVar11 = args;
      }
      prev_arg_if_range = args + -1;
      if (puVar4 == (uint8_t *)0x0) {
        prev_arg_if_range = (rtosc_arg_val_t *)0x0;
      }
      *(undefined8 *)((long)&prStack_90 + lVar2) = 0x10d7f0;
      sVar6 = rtosc_print_arg_val(prVar11,&buffer_00->type,bs,opt_00,local_34,prev_arg_if_range);
      sVar12 = local_40 + sVar6;
      pcVar9 = (char *)((long)buffer_00 + sVar6);
      local_40 = bs - sVar6;
      cVar1 = args->type;
      local_50 = args;
      *(undefined8 *)((long)&prStack_90 + lVar2) = 0x10d81e;
      pvVar7 = memchr("-asb",(int)cVar1,5);
      pcVar3 = local_48;
      sVar10 = local_40;
      uVar8 = local_58;
      if (pvVar7 == (void *)0x0) {
        uVar8 = (ulong)((int)local_58 + 1);
        if ((local_60->linelength < local_34[0]) && (0 < (int)local_58)) {
          *local_48 = '\n';
          __dest = local_48 + 5;
          __src = local_48 + 1;
          *(undefined8 *)((long)&prStack_90 + lVar2) = 0x10d85b;
          memmove(__dest,__src,sVar6 + 1);
          local_34[0] = (int)sVar6 + 4;
          pcVar3[1] = ' ';
          pcVar3[2] = ' ';
          pcVar3[3] = ' ';
          pcVar3[4] = ' ';
          sVar12 = sVar12 + 4;
          local_58 = 1;
          sVar10 = local_40 - 4;
          uVar8 = local_58;
          pcVar9 = pcVar9 + 4;
        }
      }
      local_48 = pcVar9;
      local_58 = uVar8;
      prVar11 = local_50;
      iVar5 = local_6c;
      if (local_6c == 0) {
        *(undefined8 *)((long)&prStack_90 + lVar2) = 0x10d8a5;
        iVar5 = next_arg_offset(prVar11);
      }
      pcVar3 = local_48;
      opt_00 = local_60;
      local_68 = local_68 + iVar5;
      if (local_88.val.b.data <= local_68) break;
      args = local_50 + iVar5;
      pcVar9 = local_60->sep;
      *(undefined8 *)((long)&prStack_90 + lVar2) = 0x10d8df;
      fast_strcpy(pcVar3,pcVar9,sVar10);
      local_34[0] = local_34[0] + (int)local_88.val.h;
      local_40 = sVar12 + (long)local_88.val.s;
      local_50 = (rtosc_arg_val_t *)(pcVar3 + local_88.val.h);
      bs = sVar10 - local_88.val._0_8_;
    }
  }
  return sVar12;
}

Assistant:

size_t rtosc_print_arg_vals(const rtosc_arg_val_t *args, size_t n,
                            char *buffer, size_t bs,
                            const rtosc_print_options *opt, int cols_used)
{
    size_t wrt=0;
    int args_written_this_line = (cols_used) ? 1 : 0;
    if(!opt)
        opt = default_print_options;
    size_t sep_len = strlen(opt->sep);
    char* last_sep = buffer - 1;
    STACKALLOC(rtosc_arg_val_t, args_converted, n); // only used for range conversion

    for(size_t i = 0; i < n;)
    {
        int32_t conv = rtosc_convert_to_range(args, n-i, args_converted, opt);
        const rtosc_arg_val_t* input = conv ? args_converted : args;

        size_t tmp = rtosc_print_arg_val(input, buffer, bs, opt, &cols_used, (i == 0) ? NULL : (args-1));
        wrt += tmp;
        buffer += tmp;
        bs -= tmp;

        // these compute the newlines themselves
        if(! strchr("-asb", args->type))
        linebreak_check_after_write(&cols_used, &wrt, last_sep, &buffer, &bs,
                                    tmp, &args_written_this_line,
                                    opt->linelength);

        size_t inc = conv ? conv : next_arg_offset(args);
        i += inc;
        args += inc;
        if(i<n)
        {
            assert(sep_len < bs);
            last_sep = buffer;
            fast_strcpy(buffer, opt->sep, bs);
            cols_used += sep_len;
            wrt += sep_len;
            buffer += sep_len;
            bs -= sep_len;
        }
    }
    return wrt;
}